

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_> *
__thiscall
burst::detail::
apply_impl<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>&,0ul,1ul,2ul>
          (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
           *__return_storage_ptr__,detail *this,
          tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
          *f)

{
  initializer_list<int> *as;
  initializer_list<int> *as_1;
  initializer_list<int> *as_2;
  tuple<const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&,_const_std::initializer_list<int>_&>
  *t_local;
  make_range_vector_t *f_local;
  
  as = std::
       get<0ul,std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>
                 (f);
  as_1 = std::
         get<1ul,std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>
                   (f);
  as_2 = std::
         get<2ul,std::initializer_list<int>const&,std::initializer_list<int>const&,std::initializer_list<int>const&>
                   (f);
  invoke_fn::operator()
            (__return_storage_ptr__,(invoke_fn *)&burst::invoke,(make_range_vector_t *)this,as,as_1,
             as_2);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            apply_impl
            (
                NaryFunction && f,
                Tuple && t,
                std::index_sequence<Indices...>
            )
        {
            return invoke(std::forward<NaryFunction>(f), std::get<Indices>(std::forward<Tuple>(t))...);
        }